

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

Gia_Man_t * Bmcs_ManUnfold(Bmcs_Man_t *p,int f,int nFramesAdd)

{
  Gia_Man_t **p_00;
  undefined4 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint *puVar12;
  int Fill;
  ulong uVar13;
  long lVar14;
  int iVar15;
  size_t __size;
  int iVar16;
  uint uVar17;
  int local_68;
  ulong local_60;
  
  pGVar10 = p->pGia;
  pGVar9 = p->pFrames;
  if (pGVar9->vCos->nSize - pGVar9->nRegs != (pGVar10->vCos->nSize - pGVar10->nRegs) * f) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x1f0,"Gia_Man_t *Bmcs_ManUnfold(Bmcs_Man_t *, int, int)");
  }
  if (0 < nFramesAdd) {
    iVar15 = pGVar9->nObjs;
    bVar4 = true;
    local_60 = 0;
    do {
      __size = (long)pGVar10->nObjs << 2;
      __s = malloc(__size);
      memset(__s,0xff,__size);
      uVar5 = (p->vGia2Fr).nSize;
      if (uVar5 == (p->vGia2Fr).nCap) {
        if ((int)uVar5 < 0x10) {
          ppvVar7 = (p->vGia2Fr).pArray;
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,0x80);
          }
          (p->vGia2Fr).pArray = ppvVar7;
          (p->vGia2Fr).nCap = 0x10;
        }
        else {
          ppvVar7 = (p->vGia2Fr).pArray;
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar5 << 4);
          }
          (p->vGia2Fr).pArray = ppvVar7;
          (p->vGia2Fr).nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar7 = (p->vGia2Fr).pArray;
      }
      uVar5 = (p->vGia2Fr).nSize;
      (p->vGia2Fr).nSize = uVar5 + 1;
      ppvVar7[(int)uVar5] = __s;
      uVar13 = local_60 + (uint)f;
      if (uVar13 != uVar5) {
        __assert_fail("Vec_PtrSize(&p->vGia2Fr) == f+k+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                      ,0x1f5,"Gia_Man_t *Bmcs_ManUnfold(Bmcs_Man_t *, int, int)");
      }
      iVar16 = (int)uVar13;
      if ((iVar16 < 0) || ((int)uVar5 < iVar16)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (undefined4 *)(p->vGia2Fr).pArray[uVar13];
      *puVar1 = 0;
      pGVar10 = p->pGia;
      pVVar8 = pGVar10->vCos;
      uVar13 = (ulong)(uint)pVVar8->nSize;
      if (pGVar10->nRegs < pVVar8->nSize) {
        lVar14 = 0;
        do {
          if ((int)uVar13 <= lVar14) goto LAB_0057e456;
          iVar6 = pVVar8->pArray[lVar14];
          if (((long)iVar6 < 0) || (pGVar10->nObjs <= iVar6)) goto LAB_0057e418;
          if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pGVar10->pObjs + iVar6;
          uVar5 = Bmcs_ManUnfold_rec(p,iVar6 - (*(uint *)pGVar3 & 0x1fffffff),iVar16);
          if ((int)uVar5 < 0) goto LAB_0057e475;
          uVar17 = *(uint *)pGVar3 >> 0x1d & 1;
          iVar6 = Gia_ManAppendCo(p->pFrames,uVar17 ^ uVar5);
          pGVar10 = p->pGia;
          pGVar2 = pGVar10->pObjs;
          if ((pGVar3 < pGVar2) || (pGVar2 + pGVar10->nObjs <= pGVar3)) goto LAB_0057e437;
          puVar1[(int)((ulong)((long)pGVar3 - (long)pGVar2) >> 2) * -0x55555555] = iVar6;
          bVar4 = (bool)(bVar4 & uVar17 == uVar5);
          lVar14 = lVar14 + 1;
          pVVar8 = pGVar10->vCos;
          uVar13 = (ulong)pVVar8->nSize;
        } while (lVar14 < (long)(uVar13 - (long)pGVar10->nRegs));
      }
      local_60 = local_60 + 1;
    } while (local_60 != (uint)nFramesAdd);
    if (!bVar4) {
      Vec_IntFillExtra(&p->vFr2Sat,p->pFrames->nObjs,(int)local_60);
      Vec_IntFillExtra(&p->pFrames->vCopies,p->pFrames->nObjs,Fill);
      p_00 = &p->pClean;
      Gia_ManStopP(p_00);
      pGVar9 = Gia_ManStart((p->pFrames->nObjs - iVar15) + 1000);
      p->pClean = pGVar9;
      pGVar10 = p->pFrames;
      if (0 < (pGVar10->vCopies).nSize) {
        *(pGVar10->vCopies).pArray = 0;
        if (0 < nFramesAdd) {
          pGVar11 = p->pGia;
          iVar15 = 0;
          local_68 = f;
          do {
            iVar16 = pGVar11->vCos->nSize;
            iVar6 = iVar16 - pGVar11->nRegs;
            if (iVar6 != 0 && pGVar11->nRegs <= iVar16) {
              iVar16 = 0;
              do {
                uVar5 = iVar6 * local_68 + iVar16;
                if (((int)uVar5 < 0) || (pGVar10->vCos->nSize <= (int)uVar5)) {
LAB_0057e456:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar6 = pGVar10->vCos->pArray[uVar5];
                lVar14 = (long)iVar6;
                if ((lVar14 < 0) || (pGVar10->nObjs <= iVar6)) {
LAB_0057e418:
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                pGVar3 = pGVar10->pObjs;
                uVar5 = Bmcs_ManCollect_rec(p,iVar6 - (*(uint *)(pGVar3 + lVar14) & 0x1fffffff));
                if ((int)uVar5 < 0) {
LAB_0057e475:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x132,"int Abc_LitNotCond(int, int)");
                }
                pGVar3 = pGVar3 + lVar14;
                uVar5 = Gia_ManAppendCo(p->pClean,*(uint *)pGVar3 >> 0x1d & 1 ^ uVar5);
                pGVar10 = p->pFrames;
                pGVar2 = pGVar10->pObjs;
                if ((pGVar3 < pGVar2) || (pGVar2 + pGVar10->nObjs <= pGVar3)) {
LAB_0057e437:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                if ((int)uVar5 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                pGVar9 = *p_00;
                if (pGVar9->nObjs <= (int)(uVar5 >> 1)) goto LAB_0057e418;
                uVar17 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
                pGVar9->pObjs[uVar5 >> 1].Value = uVar17;
                if (((int)uVar17 < 0) || ((pGVar10->vCopies).nSize <= (int)uVar17))
                goto LAB_0057e494;
                (pGVar10->vCopies).pArray[uVar17 & 0x7fffffff] = uVar5;
                iVar16 = iVar16 + 1;
                pGVar11 = p->pGia;
                iVar6 = pGVar11->vCos->nSize - pGVar11->nRegs;
              } while (iVar16 < iVar6);
            }
            iVar15 = iVar15 + 1;
            local_68 = local_68 + 1;
          } while (iVar15 != nFramesAdd);
        }
        *p_00 = (Gia_Man_t *)0x0;
        if (pGVar9->nObjs < 1) {
          return pGVar9;
        }
        if (pGVar9->pObjs == (Gia_Obj_t *)0x0) {
          return pGVar9;
        }
        puVar12 = &pGVar9->pObjs->Value;
        lVar14 = 0;
        while( true ) {
          uVar5 = *puVar12;
          if (((long)(int)uVar5 < 0) || ((pGVar10->vCopies).nSize <= (int)uVar5)) break;
          (pGVar10->vCopies).pArray[(int)uVar5] = -1;
          lVar14 = lVar14 + 1;
          puVar12 = puVar12 + 3;
          if (pGVar9->nObjs <= lVar14) {
            return pGVar9;
          }
        }
      }
LAB_0057e494:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Bmcs_ManUnfold( Bmcs_Man_t * p, int f, int nFramesAdd )
{
    Gia_Man_t * pNew = NULL; Gia_Obj_t * pObj;
    int i, k, iLitFrame, iLitClean, fTrivial = 1;
    int * pCopies, nFrameObjs = Gia_ManObjNum(p->pFrames);
    assert( Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia) );
    for ( k = 0; k < nFramesAdd; k++ )
    {
        // unfold this timeframe
        Vec_PtrPush( &p->vGia2Fr, ABC_FALLOC(int, Gia_ManObjNum(p->pGia)) );
        assert( Vec_PtrSize(&p->vGia2Fr) == f+k+1 );
        pCopies = Bmcs_ManCopies( p, f+k );
        //memset( pCopies, 0xFF, sizeof(int)*Gia_ManObjNum(p->pGia) );  
        pCopies[0] = 0;
        Gia_ManForEachPo( p->pGia, pObj, i )
        {
            iLitFrame = Bmcs_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f+k );
            iLitFrame = Abc_LitNotCond( iLitFrame, Gia_ObjFaninC0(pObj) );
            pCopies[Gia_ObjId(p->pGia, pObj)] = Gia_ManAppendCo( p->pFrames, iLitFrame );
            fTrivial &= (iLitFrame == 0);
        }
    }
    if ( fTrivial )
        return NULL;
    // create a clean copy of the new nodes of this timeframe
    Vec_IntFillExtra( &p->vFr2Sat, Gia_ManObjNum(p->pFrames), -1 );
    Vec_IntFillExtra( &p->pFrames->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    //assert( Vec_IntCountEntry(&p->pFrames->vCopies, -1) == Vec_IntSize(&p->pFrames->vCopies) );
    Gia_ManStopP( &p->pClean );
    p->pClean = Gia_ManStart( Gia_ManObjNum(p->pFrames) - nFrameObjs + 1000 );
    Gia_ObjSetCopyArray( p->pFrames, 0, 0 );
    for ( k = 0; k < nFramesAdd; k++ )
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
    {
        pObj = Gia_ManCo( p->pFrames, (f+k) * Gia_ManPoNum(p->pGia) + i );
        iLitClean = Bmcs_ManCollect_rec( p, Gia_ObjFaninId0p(p->pFrames, pObj) );
        iLitClean = Abc_LitNotCond( iLitClean, Gia_ObjFaninC0(pObj) );
        iLitClean = Gia_ManAppendCo( p->pClean, iLitClean );
        Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = Gia_ObjId(p->pFrames, pObj);
        Gia_ObjSetCopyArray( p->pFrames, Gia_ObjId(p->pFrames, pObj), iLitClean );
    }
    pNew = p->pClean; p->pClean = NULL;
    Gia_ManForEachObj( pNew, pObj, i )
        Gia_ObjSetCopyArray( p->pFrames, pObj->Value, -1 );
    return pNew;
}